

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O0

int google::protobuf::internal::UTF8GenericScan
              (UTF8ScanObj *st,char *str,int str_length,int *bytes_consumed)

{
  int iVar1;
  uint8 *puVar2;
  uint8 *puVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  bool bVar6;
  uint8 *local_90;
  uint8 *Tbl;
  int e0123;
  uint32 temp;
  uint32 s4567;
  uint32 s0123;
  uint32 hiadd;
  uint32 losub;
  uint8 *Tbl2;
  uint8 c;
  int e;
  uint8 *Tbl_0;
  uint8 *srclimit8;
  uint8 *srclimit;
  uint8 *src;
  uint8 *isrc;
  int eshift;
  int *bytes_consumed_local;
  int str_length_local;
  char *str_local;
  UTF8ScanObj *st_local;
  
  *bytes_consumed = 0;
  if (str_length == 0) {
    return 0xf1;
  }
  iVar1 = st->entry_shift;
  puVar4 = (uint8 *)(str + str_length);
  puVar5 = st->state_table + st->state0;
  srclimit = (uint8 *)str;
LAB_005cc4c0:
  Tbl2._4_4_ = 0;
  puVar2 = st->fast_state;
  while( true ) {
    bVar6 = false;
    if ((((ulong)srclimit & 7) != 0) && (bVar6 = false, srclimit < puVar4)) {
      bVar6 = puVar2[*srclimit] == '\0';
    }
    if (!bVar6) break;
    srclimit = srclimit + 1;
  }
  local_90 = puVar5;
  puVar3 = srclimit;
  if (((ulong)srclimit & 7) == 0) {
    do {
      do {
        srclimit = puVar3;
        if (puVar4 + -7 <= srclimit) goto LAB_005cc685;
        puVar3 = srclimit + 8;
      } while (((*(int *)srclimit - st->losub | *(int *)srclimit + st->hiadd |
                 *(int *)(srclimit + 4) - st->losub | *(int *)(srclimit + 4) + st->hiadd) &
               0x80808080) == 0);
      if ((puVar2[*srclimit] != '\0' || puVar2[srclimit[1]] != '\0') ||
          (puVar2[srclimit[2]] != '\0' || puVar2[srclimit[3]] != '\0')) goto LAB_005cc685;
    } while ((puVar2[srclimit[4]] == '\0' && puVar2[srclimit[5]] == '\0') &&
             (puVar2[srclimit[6]] == '\0' && puVar2[srclimit[7]] == '\0'));
    srclimit = srclimit + 4;
  }
LAB_005cc685:
  do {
    if (puVar4 <= srclimit) break;
    Tbl2._4_4_ = (uint)local_90[*srclimit];
    srclimit = srclimit + 1;
    if (0xef < Tbl2._4_4_) break;
    local_90 = puVar5 + (int)(Tbl2._4_4_ << ((byte)iVar1 & 0x1f));
  } while( true );
  if (Tbl2._4_4_ < 0xf0) {
    bVar6 = InStateZero(st,local_90);
    if (bVar6) {
      Tbl2._4_4_ = 0xf1;
    }
    else {
      Tbl2._4_4_ = 0xf0;
      do {
        srclimit = srclimit + -1;
        bVar6 = false;
        if (str < srclimit) {
          bVar6 = (*srclimit & 0xc0) == 0x80;
        }
      } while (bVar6);
    }
  }
  else {
    srclimit = srclimit + -1;
    bVar6 = InStateZero(st,local_90);
    if (!bVar6) {
      do {
        srclimit = srclimit + -1;
        bVar6 = false;
        if (str < srclimit) {
          bVar6 = (*srclimit & 0xc0) == 0x80;
        }
      } while (bVar6);
    }
  }
  if (Tbl2._4_4_ != 0xfd) {
    *bytes_consumed = (int)srclimit - (int)str;
    return Tbl2._4_4_;
  }
  goto LAB_005cc4c0;
}

Assistant:

int UTF8GenericScan(const UTF8ScanObj* st,
                    const char * str,
                    int str_length,
                    int* bytes_consumed) {
  *bytes_consumed = 0;
  if (str_length == 0) return kExitOK;

  int eshift = st->entry_shift;
  const uint8* isrc = reinterpret_cast<const uint8*>(str);
  const uint8* src = isrc;
  const uint8* srclimit = isrc + str_length;
  const uint8* srclimit8 = srclimit - 7;
  const uint8* Tbl_0 = &st->state_table[st->state0];

 DoAgain:
  // Do state-table scan
  int e = 0;
  uint8 c;
  const uint8* Tbl2 = &st->fast_state[0];
  const uint32 losub = st->losub;
  const uint32 hiadd = st->hiadd;
  // Check initial few bytes one at a time until 8-byte aligned
  //----------------------------
  while ((((uintptr_t)src & 0x07) != 0) &&
         (src < srclimit) &&
         Tbl2[src[0]] == 0) {
    src++;
  }
  if (((uintptr_t)src & 0x07) == 0) {
    // Do fast for groups of 8 identity bytes.
    // This covers a lot of 7-bit ASCII ~8x faster then the 1-byte loop,
    // including slowing slightly on cr/lf/ht
    //----------------------------
    while (src < srclimit8) {
      uint32 s0123 = (reinterpret_cast<const uint32 *>(src))[0];
      uint32 s4567 = (reinterpret_cast<const uint32 *>(src))[1];
      src += 8;
      // This is a fast range check for all bytes in [lowsub..0x80-hiadd)
      uint32 temp = (s0123 - losub) | (s0123 + hiadd) |
                    (s4567 - losub) | (s4567 + hiadd);
      if ((temp & 0x80808080) != 0) {
        // We typically end up here on cr/lf/ht; src was incremented
        int e0123 = (Tbl2[src[-8]] | Tbl2[src[-7]]) |
                    (Tbl2[src[-6]] | Tbl2[src[-5]]);
        if (e0123 != 0) {
          src -= 8;
          break;
        }    // Exit on Non-interchange
        e0123 = (Tbl2[src[-4]] | Tbl2[src[-3]]) |
                (Tbl2[src[-2]] | Tbl2[src[-1]]);
        if (e0123 != 0) {
          src -= 4;
          break;
        }    // Exit on Non-interchange
        // Else OK, go around again
      }
    }
  }
  //----------------------------

  // Byte-at-a-time scan
  //----------------------------
  const uint8* Tbl = Tbl_0;
  while (src < srclimit) {
    c = *src;
    e = Tbl[c];
    src++;
    if (e >= kExitIllegalStructure) {break;}
    Tbl = &Tbl_0[e << eshift];
  }
  //----------------------------


  // Exit posibilities:
  //  Some exit code, !state0, back up over last char
  //  Some exit code, state0, back up one byte exactly
  //  source consumed, !state0, back up over partial char
  //  source consumed, state0, exit OK
  // For illegal byte in state0, avoid backup up over PREVIOUS char
  // For truncated last char, back up to beginning of it

  if (e >= kExitIllegalStructure) {
    // Back up over exactly one byte of rejected/illegal UTF-8 character
    src--;
    // Back up more if needed
    if (!InStateZero(st, Tbl)) {
      do {
        src--;
      } while ((src > isrc) && ((src[0] & 0xc0) == 0x80));
    }
  } else if (!InStateZero(st, Tbl)) {
    // Back up over truncated UTF-8 character
    e = kExitIllegalStructure;
    do {
      src--;
    } while ((src > isrc) && ((src[0] & 0xc0) == 0x80));
  } else {
    // Normal termination, source fully consumed
    e = kExitOK;
  }

  if (e == kExitDoAgain) {
    // Loop back up to the fast scan
    goto DoAgain;
  }

  *bytes_consumed = src - isrc;
  return e;
}